

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eclmap.c
# Opt level: O0

void eclmap_rebuild(eclmap_t *emap)

{
  size_t sVar1;
  size_t local_38;
  size_t node_1;
  size_t node;
  seqmap_entry_t *ent;
  size_t count;
  char **p;
  eclmap_t *emap_local;
  
  sVar1 = emap->ins_names->len + emap->timeline_ins_names->len;
  free(emap->mnem_set);
  count = (size_t)malloc(sVar1 * 8);
  emap->mnem_set = (char **)count;
  emap->mnem_set_len = sVar1;
  for (node_1 = emap->ins_names->len; node_1 != 0; node_1 = node_1 - 1) {
    *(char **)count = emap->ins_names->ptr[node_1 - 1].value;
    count = count + 8;
  }
  for (local_38 = emap->timeline_ins_names->len; local_38 != 0; local_38 = local_38 - 1) {
    *(char **)count = emap->timeline_ins_names->ptr[local_38 - 1].value;
    count = count + 8;
  }
  qsort(emap->mnem_set,emap->mnem_set_len,8,strcmp_indirect);
  return;
}

Assistant:

void
eclmap_rebuild(
    eclmap_t *emap)
{
    char **p;
    size_t count = emap->ins_names->len + emap->timeline_ins_names->len;

    free(emap->mnem_set);
    emap->mnem_set = p = malloc(count * sizeof(char*));
    emap->mnem_set_len = count;

    seqmap_entry_t *ent;
    seqmap_for_each(emap->ins_names, ent)
        *p++ = ent->value;
    seqmap_for_each(emap->timeline_ins_names, ent)
        *p++ = ent->value;

    qsort(emap->mnem_set, emap->mnem_set_len, sizeof(char*), strcmp_indirect);
}